

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
* __thiscall
Catch::ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&>::operator<=
          (BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
           *__return_storage_ptr__,
          ExprLhs<type_safe::basic_optional<type_safe::direct_optional_storage<int>>const&> *this,
          int *rhs)

{
  basic_optional<type_safe::direct_optional_storage<int>_> *lhs;
  bool comparisonResult;
  StringRef local_30;
  int *local_20;
  int *rhs_local;
  ExprLhs<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (int *)this;
  this_local = (ExprLhs<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&>
                *)__return_storage_ptr__;
  comparisonResult =
       (((type_safe::direct_optional_storage<int>::
       value_type)(({parm#1}.value)()))<={parm#2})type_safe::operator<=
                 (*(basic_optional<type_safe::direct_optional_storage<int>_> **)this,rhs);
  lhs = *(basic_optional<type_safe::direct_optional_storage<int>_> **)this;
  StringRef::StringRef(&local_30,"<=");
  BinaryExpr<const_type_safe::basic_optional<type_safe::direct_optional_storage<int>_>_&,_const_int_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator <= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs <= rhs), m_lhs, "<=", rhs };
        }